

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall
c4::basic_substring<char>::first_not_of(basic_substring<char> *this,ro_substr chars,size_t start)

{
  size_t *psVar1;
  char cVar2;
  code *pcVar3;
  char **ppcVar4;
  ulong uVar5;
  bool bVar6;
  size_t sVar7;
  basic_substring<char> *pbVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar9 = chars.len;
  if (this->len < start) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      sVar7 = (*pcVar3)();
      return sVar7;
    }
    handle_error(0x1fbf87,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1756,"(start >= 0 && start <= len) || (start == len && len == 0)");
  }
  psVar1 = &this->len;
  pbVar8 = (basic_substring<char> *)0xffffffffffffffff;
  if (start < (basic_substring<char> *)*psVar1) {
    ppcVar4 = &this->str;
    do {
      pbVar8 = (basic_substring<char> *)start;
      bVar6 = uVar9 != 0;
      if ((uVar9 != 0) &&
         (cVar2 = *(char *)((long)&((basic_substring<char> *)start)->str + (long)*ppcVar4),
         pbVar8 = this, cVar2 != *chars.str)) {
        uVar5 = 1;
        do {
          uVar10 = uVar5;
          pbVar8 = (basic_substring<char> *)start;
          if (uVar9 == uVar10) break;
          pbVar8 = this;
          uVar5 = uVar10 + 1;
        } while (cVar2 != chars.str[uVar10]);
        bVar6 = uVar10 < uVar9;
      }
      this = pbVar8;
      pbVar8 = this;
    } while ((bVar6) &&
            (start = (long)&((basic_substring<char> *)start)->str + 1,
            pbVar8 = (basic_substring<char> *)0xffffffffffffffff,
            (basic_substring<char> *)start != (basic_substring<char> *)*psVar1));
  }
  return (size_t)pbVar8;
}

Assistant:

size_t first_not_of(ro_substr chars, size_t start=0) const
    {
        C4_ASSERT((start >= 0 && start <= len) || (start == len && len == 0));
        for(size_t i = start; i < len; ++i)
        {
            bool gotit = true;
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }